

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3> * __thiscall
TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3>::operator=
          (TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3> *this,
          TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3> *copy)

{
  double dVar1;
  undefined1 auVar2 [16];
  TPZManVector<TFad<6,_double>,_3> *pTVar3;
  ulong uVar4;
  ulong *puVar5;
  TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3> *in_RSI;
  TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3> *in_RDI;
  ulong uVar6;
  int64_t i;
  int64_t nel;
  TPZManVector<TFad<6,_double>,_3> *in_stack_ffffffffffffff40;
  TPZManVector<TFad<6,_double>,_3> *local_b0;
  TPZManVector<TFad<6,_double>,_3> *local_70;
  int64_t in_stack_ffffffffffffff98;
  TPZManVector<TFad<6,_double>,_3> *pTVar7;
  TPZManVector<TFad<6,_double>,_3> *in_stack_ffffffffffffffa0;
  TPZManVector<TFad<6,_double>,_3> *pTVar8;
  long local_30;
  
  if (in_RDI != in_RSI) {
    pTVar3 = (TPZManVector<TFad<6,_double>,_3> *)
             TPZVec<TPZManVector<TFad<6,_double>,_3>_>::NElements
                       (&in_RSI->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>);
    if ((((in_RDI->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNAlloc < (long)pTVar3) &&
        ((in_RDI->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore !=
         (TPZManVector<TFad<6,_double>,_3> *)0x0)) &&
       ((in_RDI->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore != in_RDI->fExtAlloc)) {
      pTVar7 = (in_RDI->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore;
      if (pTVar7 != (TPZManVector<TFad<6,_double>,_3> *)0x0) {
        dVar1 = pTVar7[-1].fExtAlloc[2].dx_[5];
        pTVar8 = pTVar7 + (long)dVar1;
        while (pTVar7 != pTVar8) {
          pTVar8 = pTVar8 + -1;
          TPZManVector<TFad<6,_double>,_3>::~TPZManVector(in_stack_ffffffffffffff40);
          in_stack_ffffffffffffffa0 = pTVar8;
        }
        operator_delete__(pTVar7[-1].fExtAlloc[2].dx_ + 5,(long)dVar1 * 0xe0 + 8);
      }
      (in_RDI->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore =
           (TPZManVector<TFad<6,_double>,_3> *)0x0;
      (in_RDI->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNAlloc = 0;
    }
    if ((long)pTVar3 < 4) {
      if (((in_RDI->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore != in_RDI->fExtAlloc) &&
         (pTVar7 = (in_RDI->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore,
         pTVar7 != (TPZManVector<TFad<6,_double>,_3> *)0x0)) {
        pTVar8 = pTVar7 + -1;
        dVar1 = pTVar7[-1].fExtAlloc[2].dx_[5];
        local_70 = pTVar7 + (long)dVar1;
        if (pTVar7 != local_70) {
          do {
            local_70 = local_70 + -1;
            TPZManVector<TFad<6,_double>,_3>::~TPZManVector(in_stack_ffffffffffffff40);
          } while (local_70 != pTVar7);
        }
        operator_delete__(pTVar8->fExtAlloc[2].dx_ + 5,(long)dVar1 * 0xe0 + 8);
      }
      (in_RDI->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNAlloc = 0;
      (in_RDI->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore = in_RDI->fExtAlloc;
      (in_RDI->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNElements = (int64_t)pTVar3;
      pTVar7 = pTVar3;
    }
    else {
      pTVar7 = pTVar3;
      if ((in_RDI->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNAlloc < (long)pTVar3) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = pTVar3;
        uVar4 = SUB168(auVar2 * ZEXT816(0xe0),0);
        uVar6 = uVar4 + 8;
        if (SUB168(auVar2 * ZEXT816(0xe0),8) != 0 || 0xfffffffffffffff7 < uVar4) {
          uVar6 = 0xffffffffffffffff;
        }
        puVar5 = (ulong *)operator_new__(uVar6);
        *puVar5 = (ulong)pTVar3;
        pTVar8 = (TPZManVector<TFad<6,_double>,_3> *)(puVar5 + 1);
        if (pTVar3 != (TPZManVector<TFad<6,_double>,_3> *)0x0) {
          local_b0 = pTVar8;
          do {
            TPZManVector<TFad<6,_double>,_3>::TPZManVector
                      (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
            local_b0 = local_b0 + 1;
          } while (local_b0 != pTVar8 + (long)pTVar3);
        }
        (in_RDI->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore = pTVar8;
        (in_RDI->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNAlloc = (int64_t)pTVar7;
        (in_RDI->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNElements = (int64_t)pTVar7;
      }
      else {
        (in_RDI->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNElements = (int64_t)pTVar3;
      }
    }
    for (local_30 = 0; local_30 < (long)pTVar7; local_30 = local_30 + 1) {
      TPZManVector<TFad<6,_double>,_3>::operator=((TPZManVector<TFad<6,_double>,_3> *)in_RSI,pTVar7)
      ;
    }
  }
  return in_RDI;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}